

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record_Query_R_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Record_Query_R_PDU::Record_Query_R_PDU(Record_Query_R_PDU *this,KDataStream *stream)

{
  Simulation_Management_Header::Simulation_Management_Header
            (&this->super_Simulation_Management_Header);
  Reliability_Header::Reliability_Header(&this->super_Reliability_Header);
  (this->super_Simulation_Management_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Record_Query_R_PDU_00222cd0;
  (this->super_Reliability_Header)._vptr_Reliability_Header =
       (_func_int **)&PTR__Record_Query_R_PDU_00222d10;
  (this->m_vui32RecID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vui32RecID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vui32RecID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Decode(this,stream,false);
  return;
}

Assistant:

Record_Query_R_PDU::Record_Query_R_PDU(KDataStream &stream) noexcept(false)
{
    Decode( stream, false );
}